

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

void __thiscall
google::protobuf::io::EpsCopyOutputStream::EpsCopyOutputStream
          (EpsCopyOutputStream *this,void *data,int size,ZeroCopyOutputStream *stream,
          bool deterministic,uint8_t **pp)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  
  this->stream_ = stream;
  this->had_error_ = false;
  this->aliasing_enabled_ = false;
  this->is_serialization_deterministic_ = deterministic;
  puVar3 = (uint8_t *)0x0;
  puVar1 = (uint8_t *)((long)data + ((ulong)(uint)size - 0x10));
  puVar2 = (uint8_t *)data;
  if (size < 0x11) {
    puVar2 = this->buffer_;
    puVar1 = this->buffer_ + size;
    puVar3 = (uint8_t *)data;
  }
  this->skip_check_consistency = false;
  this->end_ = puVar1;
  this->buffer_end_ = puVar3;
  *pp = puVar2;
  return;
}

Assistant:

EpsCopyOutputStream(void* data, int size, ZeroCopyOutputStream* stream,
                      bool deterministic, uint8_t** pp)
      : stream_(stream), is_serialization_deterministic_(deterministic) {
    *pp = SetInitialBuffer(data, size);
  }